

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O2

void __thiscall kj::anon_unknown_77::AsyncPipe::BlockedRead::shutdownWrite(BlockedRead *this)

{
  AsyncPipe *this_00;
  StringPtr cancelReason;
  
  cancelReason.content.size_ = 0x1b;
  cancelReason.content.ptr = "shutdownWrite() was called";
  Canceler::cancel(&this->canceler,cancelReason);
  (**this->fulfiller->_vptr_PromiseFulfiller)();
  this_00 = this->pipe;
  if ((BlockedRead *)(this_00->state).ptr == this) {
    (this_00->state).ptr = (AsyncIoStream *)0x0;
  }
  AsyncPipe::shutdownWrite(this_00);
  return;
}

Assistant:

void shutdownWrite() override {
      canceler.cancel("shutdownWrite() was called");
      fulfiller.fulfill(kj::cp(readSoFar));
      pipe.endState(*this);
      pipe.shutdownWrite();
    }